

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryFuncs.cpp
# Opt level: O3

Type * __thiscall
slang::ast::builtins::ArrayDimensionFunction::checkArguments
          (ArrayDimensionFunction *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_4)

{
  Compilation *pCVar1;
  bool bVar2;
  Type *pTVar3;
  Diagnostic *this_00;
  Type *pTVar4;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar2 = SystemSubroutine::checkArgCount
                    (&this->super_SystemSubroutine,context,false,args,range,1,1);
  if (bVar2) {
    pTVar4 = ((*args->_M_ptr)->type).ptr;
    bVar2 = Type::isIntegral(pTVar4);
    if ((!bVar2) && (bVar2 = Type::isUnpackedArray(pTVar4), !bVar2)) {
      pTVar3 = pTVar4->canonical;
      if (pTVar3 == (Type *)0x0) {
        Type::resolveCanonical(pTVar4);
        pTVar3 = pTVar4->canonical;
      }
      if ((pTVar3->super_Symbol).kind != StringType) {
        pTVar4 = SystemSubroutine::badArg(&this->super_SystemSubroutine,context,*args->_M_ptr);
        return pTVar4;
      }
    }
    bVar2 = Type::hasFixedRange(pTVar4);
    if ((bVar2) || ((*args->_M_ptr)->kind != DataType)) {
      return pCVar1->integerType;
    }
    this_00 = ASTContext::addDiag(context,(DiagCode)0x21000b,(*args->_M_ptr)->sourceRange);
    Diagnostic::operator<<(this_00,&(this->super_SystemSubroutine).name);
  }
  return pCVar1->errorType;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 1, 1))
            return comp.getErrorType();

        auto& type = *args[0]->type;
        if (!type.isIntegral() && !type.isUnpackedArray() && !type.isString())
            return badArg(context, *args[0]);

        // Spec says we have to disallow this case.
        if (!type.hasFixedRange() && args[0]->kind == ExpressionKind::DataType) {
            context.addDiag(diag::QueryOnDynamicType, args[0]->sourceRange) << name;
            return comp.getErrorType();
        }

        return comp.getIntegerType();
    }